

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_operations.hpp
# Opt level: O0

bool viennamath::can_simplify_impl<viennamath::rt_expression_interface<double>,double>
               (long *lhs,long *param_2)

{
  byte bVar1;
  ulong uVar2;
  double dVar3;
  byte local_21;
  rt_expression_interface<double> *rhs_local;
  rt_expression_interface<double> *lhs_local;
  
  uVar2 = (**(code **)(*lhs + 0x40))();
  if ((uVar2 & 1) != 0) {
    dVar3 = (double)(**(code **)(*lhs + 0x48))();
    if ((dVar3 == 0.0) && (!NAN(dVar3))) {
      return true;
    }
  }
  uVar2 = (**(code **)(*param_2 + 0x40))();
  if ((uVar2 & 1) != 0) {
    dVar3 = (double)(**(code **)(*param_2 + 0x48))();
    if ((dVar3 == 1.0) && (!NAN(dVar3))) {
      return true;
    }
  }
  bVar1 = (**(code **)(*lhs + 0x88))();
  local_21 = 1;
  if ((bVar1 & 1) == 0) {
    local_21 = (**(code **)(*param_2 + 0x88))();
  }
  return (bool)(local_21 & 1);
}

Assistant:

bool can_simplify_impl(const InterfaceType * lhs, op_div<NumericT>, const InterfaceType * rhs)
  {
    if (lhs->is_constant())
    {
      if (lhs->unwrap() == 0.0)
      {
        //std::cout << "can_simplify: true in op_div" << std::endl;
        return true;
      }
    }
    if (rhs->is_constant())
    {
      if (rhs->unwrap() == 1.0)
      {
        //std::cout << "can_simplify: true in op_div" << std::endl;
        return true;
      }
    }
    return lhs->can_simplify() || rhs->can_simplify();
  }